

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O3

long testStringToDouble(int count)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  string value;
  string local_58;
  timeval local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"123.45","");
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  _Var2 = local_38.tv_usec;
  _Var1 = local_38.tv_sec;
  if (0 < count) {
    do {
      FIX::DoubleConvertor::convert(&local_58);
      count = count + -1;
    } while (count != 0);
  }
  gettimeofday(&local_38,(__timezone_ptr_t)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return (local_38.tv_usec - (_Var2 + (long)((double)_Var1 * 1000000.0))) +
         (long)((double)local_38.tv_sec * 1000000.0);
}

Assistant:

long testStringToDouble(int count) {
  std::string value("123.45");
  count = count - 1;

  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::DoubleConvertor::convert(value);
  }
  return GetTickCount() - start;
}